

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

char * __thiscall ODDLParser::OpenDDLParser::parseHeader(OpenDDLParser *this,char *in,char *end)

{
  char cVar1;
  char cVar2;
  pointer ppDVar3;
  byte bVar4;
  unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> prop;
  __uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> __p;
  Text *this_00;
  char *pcVar5;
  DDLNode *pDVar6;
  ostream *poVar7;
  _Head_base<0UL,_ODDLParser::Property_*,_false> __p_00;
  bool bVar8;
  unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> first;
  allocator<char> local_b1;
  __uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> local_b0;
  unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> prev;
  unique_ptr<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_> name;
  Property *prop_;
  string type;
  Name *name_;
  Text *id;
  
  if (in == end || in == (char *)0x0) {
    return in;
  }
  id = (Text *)0x0;
  pcVar5 = parseIdentifier(in,end,&id);
  pcVar5 = lookForNextToken<char>(pcVar5,end);
  this_00 = id;
  if (id == (Text *)0x0) {
    return pcVar5;
  }
  if (id->m_buffer == (char *)0x0) {
LAB_0058bf69:
    poVar7 = std::operator<<((ostream *)&std::cerr,"nullptr returned by creating DDLNode.");
    std::endl<char,std::char_traits<char>>(poVar7);
    bVar4 = 0;
    pDVar6 = (DDLNode *)0x0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type,id->m_buffer,(allocator<char> *)&name_);
    ppDVar3 = (this->m_stack).
              super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((this->m_stack).
        super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
        super__Vector_impl_data._M_start == ppDVar3) {
      pDVar6 = (DDLNode *)0x0;
    }
    else {
      pDVar6 = ppDVar3[-1];
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&name_,"",(allocator<char> *)&name)
    ;
    pDVar6 = DDLNode::create(&type,(string *)&name_,pDVar6);
    std::__cxx11::string::~string((string *)&name_);
    std::__cxx11::string::~string((string *)&type);
    if (pDVar6 == (DDLNode *)0x0) goto LAB_0058bf69;
    pushNode(this,pDVar6);
    bVar4 = 1;
  }
  Text::~Text(this_00);
  operator_delete(this_00,0x18);
  name_ = (Name *)0x0;
  pcVar5 = parseName(pcVar5,end,&name_);
  name._M_t.super___uniq_ptr_impl<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_>._M_t.
  super__Tuple_impl<0UL,_ODDLParser::Name_*,_std::default_delete<ODDLParser::Name>_>.
  super__Head_base<0UL,_ODDLParser::Name_*,_false>._M_head_impl =
       (__uniq_ptr_data<ODDLParser::Name,_std::default_delete<ODDLParser::Name>,_true,_true>)
       (__uniq_ptr_data<ODDLParser::Name,_std::default_delete<ODDLParser::Name>,_true,_true>)name_;
  if (name_ != (Name *)0x0 && !(bool)(bVar4 ^ 1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type,name_->m_id->m_buffer,(allocator<char> *)&first);
    DDLNode::setName(pDVar6,&type);
    std::__cxx11::string::~string((string *)&type);
  }
  first._M_t.super___uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>
  ._M_t.super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>.
  super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl =
       (__uniq_ptr_data<ODDLParser::Property,_std::default_delete<ODDLParser::Property>,_true,_true>
       )(__uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>)0x0;
  pcVar5 = lookForNextToken<char>(pcVar5,end);
  if (*pcVar5 == '(') {
    local_b0._M_t.
    super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>.
    super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl =
         (tuple<ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>)
         (_Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>)0x0;
    prev._M_t.
    super___uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>._M_t.
    super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>.
    super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl =
         (__uniq_ptr_data<ODDLParser::Property,_std::default_delete<ODDLParser::Property>,_true,_true>
          )(__uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>)0x0;
    pcVar5 = pcVar5 + 1;
    while( true ) {
      cVar1 = *pcVar5;
      bVar8 = pcVar5 == end;
      if (bVar8 || cVar1 == ')') break;
      prop_ = (Property *)0x0;
      pcVar5 = parseProperty(pcVar5,end,&prop_);
      std::__uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::reset
                (&local_b0,prop_);
      pcVar5 = lookForNextToken<char>(pcVar5,end);
      __p._M_t.
      super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>.
      super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl =
           local_b0._M_t.
           super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>
           .super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl;
      cVar2 = *pcVar5;
      if ((cVar2 != ')') && (cVar2 != ',')) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&type,")",&local_b1);
        logInvalidTokenError(pcVar5,&type,this->m_logCallback);
        std::__cxx11::string::~string((string *)&type);
        goto LAB_0058c13c;
      }
      if (cVar2 != ',' &&
          local_b0._M_t.
          super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>
          .super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>)0x0)
      {
        __p_00._M_head_impl =
             (Property *)
             local_b0._M_t.
             super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>
             .super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl;
        if ((__uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>)
            first._M_t.
            super___uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>.
            _M_t.
            super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>
            .super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>)0x0)
        {
          local_b0._M_t.
          super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>
          .super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl =
               (tuple<ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>)
               (_Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>
               )0x0;
          std::__uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::
          reset((__uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> *
                )&first,(pointer)__p._M_t.
                                 super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>
                                 .super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl)
          ;
          __p_00._M_head_impl =
               (Property *)
               local_b0._M_t.
               super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>
               .super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl;
        }
        if ((__uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>)
            prev._M_t.
            super___uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>.
            _M_t.
            super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>
            .super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>)0x0)
        {
          *(Property **)
           ((long)prev._M_t.
                  super___uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>
                  .super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl + 0x18) =
               __p_00._M_head_impl;
          __p_00._M_head_impl = (pointer)0x0;
        }
        local_b0._M_t.
        super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>.
        super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl =
             (tuple<ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>)
             (_Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>)
             0x0;
        std::__uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::
        reset((__uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> *)
              &prev,__p_00._M_head_impl);
      }
    }
    pcVar5 = pcVar5 + 1;
LAB_0058c13c:
    std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::~unique_ptr
              (&prev);
    std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::~unique_ptr
              ((unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> *)
               &local_b0);
    if (!bVar8 && cVar1 != ')') {
      pcVar5 = (char *)0x0;
      goto LAB_0058c177;
    }
  }
  prop._M_t.super___uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>.
  _M_t.super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>.
  super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl =
       first._M_t.
       super___uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>._M_t.
       super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>.
       super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl;
  if (!(bool)(bVar4 ^ 1) &&
      (__uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>)
      first._M_t.
      super___uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>._M_t.
      super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>.
      super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>)0x0) {
    first._M_t.
    super___uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>._M_t.
    super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>.
    super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl =
         (__uniq_ptr_data<ODDLParser::Property,_std::default_delete<ODDLParser::Property>,_true,_true>
          )(__uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>)0x0;
    DDLNode::setProperties
              (pDVar6,(Property *)
                      prop._M_t.
                      super___uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>
                      .super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl);
  }
LAB_0058c177:
  std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::~unique_ptr
            (&first);
  std::unique_ptr<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_>::~unique_ptr(&name);
  return pcVar5;
}

Assistant:

char *OpenDDLParser::parseHeader( char *in, char *end ) {
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    Text *id( ddl_nullptr );
    in = OpenDDLParser::parseIdentifier( in, end, &id );

#ifdef DEBUG_HEADER_NAME
    dumpId( id );
#endif // DEBUG_HEADER_NAME

    in = lookForNextToken( in, end );
    if( ddl_nullptr != id ) {
        // store the node
        DDLNode *node( createDDLNode( id, this ) );
        if( ddl_nullptr != node ) {
            pushNode( node );
        } else {
            std::cerr << "nullptr returned by creating DDLNode." << std::endl;
        }
        delete id;

		Name *name_(ddl_nullptr);
		in = OpenDDLParser::parseName(in, end, &name_);
		std::unique_ptr<Name> name(name_);
        if( ddl_nullptr != name && ddl_nullptr != node ) {
            const std::string nodeName( name->m_id->m_buffer );
            node->setName( nodeName );
        }


		std::unique_ptr<Property> first;
		in = lookForNextToken(in, end);
		if (*in == Grammar::OpenPropertyToken[0]) {
			in++;
			std::unique_ptr<Property> prop, prev;
			while (*in != Grammar::ClosePropertyToken[0] && in != end) {
				Property *prop_(ddl_nullptr);
				in = OpenDDLParser::parseProperty(in, end, &prop_);
				prop.reset(prop_);
				in = lookForNextToken(in, end);

				if (*in != Grammar::CommaSeparator[0] && *in != Grammar::ClosePropertyToken[0]) {
					logInvalidTokenError(in, Grammar::ClosePropertyToken, m_logCallback);
					return ddl_nullptr;
				}

				if (ddl_nullptr != prop && *in != Grammar::CommaSeparator[0]) {
					if (ddl_nullptr == first) {
						first = std::move(prop);
					}
					if (ddl_nullptr != prev) {
						prev->m_next = prop.release();
					}
					prev = std::move(prop);
				}
			}
			++in;
		}

		// set the properties
		if (first && ddl_nullptr != node) {
			node->setProperties(first.release());
		}
    }

    return in;
}